

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

_Bool bitset_resize(bitset_t *bitset,size_t newarraysize,_Bool padwithzeroes)

{
  ulong uVar1;
  long lVar2;
  uint64_t *puVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (newarraysize >> 0x3a != 0) {
    return false;
  }
  uVar1 = bitset->arraysize;
  sVar5 = newarraysize;
  if (uVar1 < newarraysize) {
    sVar5 = uVar1;
  }
  if (bitset->capacity < newarraysize) {
    lVar2 = 0x3f;
    if (newarraysize != 0) {
      for (; newarraysize >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar4 = 0xffffffffffffffff >> (~(byte)lVar2 & 0x3f);
    puVar3 = (uint64_t *)realloc(bitset->array,uVar4 * 8 + 8);
    if (puVar3 == (uint64_t *)0x0) {
      return false;
    }
    bitset->capacity = uVar4 + 1;
    bitset->array = puVar3;
  }
  if (uVar1 < newarraysize && padwithzeroes) {
    memset(bitset->array + sVar5,0,(newarraysize - sVar5) * 8);
  }
  bitset->arraysize = newarraysize;
  return true;
}

Assistant:

bool bitset_resize(bitset_t *bitset,  size_t newarraysize, bool padwithzeroes) {
  if(newarraysize > SIZE_MAX/64) { return false; }
  size_t smallest = newarraysize < bitset->arraysize ? newarraysize : bitset->arraysize;
  if (bitset->capacity < newarraysize) {
    uint64_t *newarray;
    size_t newcapacity = (UINT64_C(0xFFFFFFFFFFFFFFFF) >> cbitset_leading_zeroes(newarraysize)) + 1;
    if ((newarray = (uint64_t *) realloc(bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
      return false;
    }
    bitset->capacity = newcapacity;
    bitset->array = newarray;
  }
  if (padwithzeroes && (newarraysize > smallest)) {
    memset(bitset->array + smallest,0,sizeof(uint64_t) * (newarraysize - smallest));
  }
  bitset->arraysize = newarraysize;
  return true; // success!
}